

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * Cudd_addGeneralVectorCompose(DdManager *dd,DdNode *f,DdNode **vectorOn,DdNode **vectorOff)

{
  uint i_00;
  int iVar1;
  DdHashTable *table_00;
  DdNode *pDVar2;
  int local_44;
  int i;
  int deepest;
  DdNode *res;
  DdHashTable *table;
  DdNode **vectorOff_local;
  DdNode **vectorOn_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    table_00 = cuddHashTableInit(dd,1,2);
    if (table_00 == (DdHashTable *)0x0) {
      return (DdNode *)0x0;
    }
    local_44 = dd->size;
    do {
      local_44 = local_44 + -1;
      if (local_44 < 0) break;
      i_00 = dd->invperm[local_44];
      iVar1 = ddIsIthAddVarPair(dd,vectorOn[(int)i_00],vectorOff[(int)i_00],i_00);
    } while (iVar1 != 0);
    pDVar2 = cuddAddGeneralVectorComposeRecur(dd,table_00,f,vectorOn,vectorOff,local_44);
    if (pDVar2 != (DdNode *)0x0) {
      *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    }
    cuddHashTableQuit(table_00);
    if (dd->reordered != 1) {
      if (pDVar2 != (DdNode *)0x0) {
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + -1;
      }
      return pDVar2;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_addGeneralVectorCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vectorOn,
  DdNode ** vectorOff)
{
    DdHashTable         *table;
    DdNode              *res;
    int                 deepest;
    int                 i;

    do {
        dd->reordered = 0;
        /* Initialize local cache. */
        table = cuddHashTableInit(dd,1,2);
        if (table == NULL) return(NULL);

        /* Find deepest real substitution. */
        for (deepest = dd->size - 1; deepest >= 0; deepest--) {
            i = dd->invperm[deepest];
            if (!ddIsIthAddVarPair(dd,vectorOn[i],vectorOff[i],i)) {
                break;
            }
        }

        /* Recursively solve the problem. */
        res = cuddAddGeneralVectorComposeRecur(dd,table,f,vectorOn,
                                               vectorOff,deepest);
        if (res != NULL) cuddRef(res);

        /* Dispose of local cache. */
        cuddHashTableQuit(table);
    } while (dd->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}